

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O3

void setpath(lua_State *L,char *fieldname,char *envname,char *def,int noenv)

{
  char *pcVar1;
  TValue *pTVar2;
  
  pcVar1 = getenv(envname);
  if (noenv == 0 && pcVar1 != (char *)0x0) {
    pcVar1 = luaL_gsub(L,pcVar1,";;",";\x01;");
    luaL_gsub(L,pcVar1,"\x01",def);
    pTVar2 = L->top + -1;
    do {
      pTVar2[-1] = *pTVar2;
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 < L->top);
    L->top = L->top + -1;
  }
  else {
    lua_pushstring(L,def);
  }
  lua_setfield(L,-2,fieldname);
  return;
}

Assistant:

static void setpath(lua_State *L, const char *fieldname, const char *envname,
		    const char *def, int noenv)
{
#if LJ_TARGET_CONSOLE
  const char *path = NULL;
  UNUSED(envname);
#else
  const char *path = getenv(envname);
#endif
  if (path == NULL || noenv) {
    lua_pushstring(L, def);
  } else {
    path = luaL_gsub(L, path, LUA_PATHSEP LUA_PATHSEP,
			      LUA_PATHSEP AUXMARK LUA_PATHSEP);
    luaL_gsub(L, path, AUXMARK, def);
    lua_remove(L, -2);
  }
  setprogdir(L);
  lua_setfield(L, -2, fieldname);
}